

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcDfs.c
# Opt level: O3

void Abc_NtkDfs_iter(Vec_Ptr_t *vStack,Abc_Obj_t *pRoot,Vec_Ptr_t *vNodes)

{
  size_t sVar1;
  Abc_Ntk_t *pAVar2;
  Abc_Ntk_t *pAVar3;
  void *pvVar4;
  uint uVar5;
  void **ppvVar6;
  int iVar7;
  int Fill;
  int Fill_00;
  int iVar8;
  long *plVar9;
  long lVar10;
  uint uVar11;
  int *piVar12;
  
  pAVar2 = pRoot->pNtk;
  iVar7 = pRoot->Id;
  Vec_IntFillExtra(&pAVar2->vTravIds,iVar7 + 1,(int)vNodes);
  if (((long)iVar7 < 0) || ((pAVar2->vTravIds).nSize <= iVar7)) {
LAB_001c15af:
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                  ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
  }
  pAVar3 = pRoot->pNtk;
  iVar8 = pAVar3->nTravIds;
  if ((pAVar2->vTravIds).pArray[iVar7] == iVar8) {
    return;
  }
  iVar7 = pRoot->Id;
  Vec_IntFillExtra(&pAVar3->vTravIds,iVar7 + 1,Fill);
  if (((long)iVar7 < 0) || ((pAVar3->vTravIds).nSize <= iVar7)) {
LAB_001c160c:
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                  ,0x1c0,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
  }
  (pAVar3->vTravIds).pArray[iVar7] = iVar8;
  uVar5 = *(uint *)&pRoot->field_0x14 & 0xf;
  if (uVar5 == 2) {
    return;
  }
  if (uVar5 == 5) {
    return;
  }
  if (pRoot->pNtk->ntkType == ABC_NTK_STRASH) {
    if (**(int **)((ulong)pRoot & 0xfffffffffffffffe) != 3) {
LAB_001c162b:
      __assert_fail("Abc_NtkIsStrash(Abc_ObjRegular(pNode)->pNtk)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abc/abc.h"
                    ,0x18d,"int Abc_AigNodeIsConst(Abc_Obj_t *)");
    }
    if ((*(uint *)((long)((ulong)pRoot & 0xfffffffffffffffe) + 0x14) & 0xf) == 1) {
      return;
    }
  }
  vStack->nSize = 0;
  iVar7 = vStack->nCap;
  ppvVar6 = vStack->pArray;
  if (iVar7 == 0) {
    if (ppvVar6 == (void **)0x0) {
      ppvVar6 = (void **)malloc(0x80);
      iVar7 = 0;
    }
    else {
      ppvVar6 = (void **)realloc(ppvVar6,0x80);
      iVar7 = vStack->nSize;
    }
    vStack->pArray = ppvVar6;
    vStack->nCap = 0x10;
    vStack->nSize = iVar7 + 1;
    ppvVar6[iVar7] = pRoot;
    if (iVar7 + 1 == 0x10) {
      if (vStack->pArray == (void **)0x0) {
        ppvVar6 = (void **)malloc(0x100);
      }
      else {
        ppvVar6 = (void **)realloc(vStack->pArray,0x100);
      }
      vStack->pArray = ppvVar6;
      vStack->nCap = 0x20;
      goto LAB_001c11f0;
    }
  }
  else {
    vStack->nSize = 1;
    *ppvVar6 = pRoot;
    if (iVar7 == 1) {
      if (vStack->pArray == (void **)0x0) {
        ppvVar6 = (void **)malloc(0x80);
      }
      else {
        ppvVar6 = (void **)realloc(vStack->pArray,0x80);
      }
      vStack->pArray = ppvVar6;
      vStack->nCap = 0x10;
      goto LAB_001c11f0;
    }
  }
  ppvVar6 = vStack->pArray;
LAB_001c11f0:
  iVar7 = vStack->nSize;
  iVar8 = iVar7 + 1;
  vStack->nSize = iVar8;
  ppvVar6[iVar7] = (void *)0x0;
  if (-1 < (long)iVar7) {
    do {
      ppvVar6 = vStack->pArray;
      uVar5 = iVar8 - 1;
      vStack->nSize = uVar5;
      if (uVar5 == 0) {
        __assert_fail("p->nSize > 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecPtr.h"
                      ,0x2cc,"void *Vec_PtrPop(Vec_Ptr_t *)");
      }
      pvVar4 = ppvVar6[uVar5];
      uVar5 = iVar8 - 2;
      vStack->nSize = uVar5;
      plVar9 = (long *)ppvVar6[uVar5];
      if ((*(uint *)((long)plVar9 + 0x14) & 0xf) == 6) {
        __assert_fail("!Abc_ObjIsNet(pNode)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abc/abcDfs.c"
                      ,0x218,"void Abc_NtkDfs_iter(Vec_Ptr_t *, Abc_Obj_t *, Vec_Ptr_t *)");
      }
      if (*(int *)((long)plVar9 + 0x1c) == (int)pvVar4) {
        uVar5 = vNodes->nSize;
        if (uVar5 == vNodes->nCap) {
          if ((int)uVar5 < 0x10) {
            if (vNodes->pArray == (void **)0x0) {
              ppvVar6 = (void **)malloc(0x80);
            }
            else {
              ppvVar6 = (void **)realloc(vNodes->pArray,0x80);
            }
            vNodes->pArray = ppvVar6;
            vNodes->nCap = 0x10;
          }
          else {
            if (vNodes->pArray == (void **)0x0) {
              ppvVar6 = (void **)malloc((ulong)uVar5 << 4);
            }
            else {
              ppvVar6 = (void **)realloc(vNodes->pArray,(ulong)uVar5 << 4);
            }
            vNodes->pArray = ppvVar6;
            vNodes->nCap = uVar5 * 2;
          }
        }
        else {
          ppvVar6 = vNodes->pArray;
        }
        iVar7 = vNodes->nSize;
        vNodes->nSize = iVar7 + 1;
        ppvVar6[iVar7] = plVar9;
LAB_001c1473:
        iVar8 = vStack->nSize;
      }
      else {
        uVar11 = vStack->nCap;
        if (uVar5 == uVar11) {
          if (uVar5 < 0x10) {
            ppvVar6 = (void **)realloc(ppvVar6,0x80);
            uVar11 = 0x10;
          }
          else {
            uVar11 = uVar5 * 2;
            ppvVar6 = (void **)realloc(ppvVar6,(ulong)uVar11 * 8);
          }
          vStack->pArray = ppvVar6;
          vStack->nCap = uVar11;
        }
        iVar7 = vStack->nSize;
        vStack->nSize = iVar7 + 1U;
        ppvVar6[iVar7] = plVar9;
        if (iVar7 + 1U == uVar11) {
          if (iVar7 < 0xf) {
            if (vStack->pArray == (void **)0x0) {
              ppvVar6 = (void **)malloc(0x80);
            }
            else {
              ppvVar6 = (void **)realloc(vStack->pArray,0x80);
            }
            vStack->pArray = ppvVar6;
            vStack->nCap = 0x10;
          }
          else {
            sVar1 = (ulong)(uVar11 * 2) * 8;
            if (vStack->pArray == (void **)0x0) {
              ppvVar6 = (void **)malloc(sVar1);
            }
            else {
              ppvVar6 = (void **)realloc(vStack->pArray,sVar1);
            }
            vStack->pArray = ppvVar6;
            vStack->nCap = uVar11 * 2;
          }
        }
        else {
          ppvVar6 = vStack->pArray;
        }
        lVar10 = (long)pvVar4 << 0x20;
        iVar7 = vStack->nSize;
        vStack->nSize = iVar7 + 1;
        ppvVar6[iVar7] = (void *)(lVar10 + 0x100000000 >> 0x20);
        plVar9 = *(long **)(*(long *)(*(long *)(*plVar9 + 0x20) + 8) +
                           (long)*(int *)(plVar9[4] + (lVar10 >> 0x1e)) * 8);
        piVar12 = (int *)*plVar9;
        if (*piVar12 == 1) {
          plVar9 = *(long **)(*(long *)(*(long *)(piVar12 + 8) + 8) + (long)*(int *)plVar9[4] * 8);
          piVar12 = (int *)*plVar9;
        }
        iVar8 = (int)plVar9[2];
        Vec_IntFillExtra((Vec_Int_t *)(piVar12 + 0x38),iVar8 + 1,iVar7);
        if (((long)iVar8 < 0) || (piVar12[0x39] <= iVar8)) goto LAB_001c15af;
        lVar10 = *plVar9;
        iVar7 = *(int *)(lVar10 + 0xd8);
        if (*(int *)(*(long *)(piVar12 + 0x3a) + (long)iVar8 * 4) == iVar7) goto LAB_001c1473;
        iVar8 = (int)plVar9[2];
        Vec_IntFillExtra((Vec_Int_t *)(lVar10 + 0xe0),iVar8 + 1,Fill_00);
        if (((long)iVar8 < 0) || (*(int *)(lVar10 + 0xe4) <= iVar8)) goto LAB_001c160c;
        *(int *)(*(long *)(lVar10 + 0xe8) + (long)iVar8 * 4) = iVar7;
        uVar5 = *(uint *)((long)plVar9 + 0x14) & 0xf;
        if ((uVar5 == 2) || (uVar5 == 5)) goto LAB_001c1473;
        if (*(int *)*plVar9 == 3) {
          if (**(int **)((ulong)plVar9 & 0xfffffffffffffffe) != 3) goto LAB_001c162b;
          if ((*(uint *)((long)((ulong)plVar9 & 0xfffffffffffffffe) + 0x14) & 0xf) == 1)
          goto LAB_001c1473;
        }
        uVar5 = vStack->nCap;
        uVar11 = vStack->nSize;
        if (uVar11 == uVar5) {
          if ((int)uVar11 < 0x10) {
            if (vStack->pArray == (void **)0x0) {
              ppvVar6 = (void **)malloc(0x80);
            }
            else {
              ppvVar6 = (void **)realloc(vStack->pArray,0x80);
            }
            uVar5 = 0x10;
          }
          else {
            uVar5 = uVar11 * 2;
            if (vStack->pArray == (void **)0x0) {
              ppvVar6 = (void **)malloc((ulong)uVar11 << 4);
            }
            else {
              ppvVar6 = (void **)realloc(vStack->pArray,(ulong)uVar11 << 4);
            }
          }
          vStack->pArray = ppvVar6;
          vStack->nCap = uVar5;
          uVar11 = vStack->nSize;
        }
        else {
          ppvVar6 = vStack->pArray;
        }
        vStack->nSize = uVar11 + 1;
        ppvVar6[(int)uVar11] = plVar9;
        if (uVar11 + 1 == uVar5) {
          if ((int)uVar11 < 0xf) {
            if (vStack->pArray == (void **)0x0) {
              ppvVar6 = (void **)malloc(0x80);
            }
            else {
              ppvVar6 = (void **)realloc(vStack->pArray,0x80);
            }
            vStack->pArray = ppvVar6;
            vStack->nCap = 0x10;
          }
          else {
            sVar1 = (ulong)(uVar5 * 2) * 8;
            if (vStack->pArray == (void **)0x0) {
              ppvVar6 = (void **)malloc(sVar1);
            }
            else {
              ppvVar6 = (void **)realloc(vStack->pArray,sVar1);
            }
            vStack->pArray = ppvVar6;
            vStack->nCap = uVar5 * 2;
          }
        }
        else {
          ppvVar6 = vStack->pArray;
        }
        iVar7 = vStack->nSize;
        iVar8 = iVar7 + 1;
        vStack->nSize = iVar8;
        ppvVar6[iVar7] = (void *)0x0;
      }
    } while (0 < iVar8);
  }
  return;
}

Assistant:

void Abc_NtkDfs_iter( Vec_Ptr_t * vStack, Abc_Obj_t * pRoot, Vec_Ptr_t * vNodes )
{
    Abc_Obj_t * pNode, * pFanin;
    int iFanin;
    // if this node is already visited, skip
    if ( Abc_NodeIsTravIdCurrent( pRoot ) )
        return;
    // mark the node as visited
    Abc_NodeSetTravIdCurrent( pRoot );
    // skip the CI
    if ( Abc_ObjIsCi(pRoot) || (Abc_NtkIsStrash(pRoot->pNtk) && Abc_AigNodeIsConst(pRoot)) )
        return;
    // add the CI
    Vec_PtrClear( vStack );
    Vec_PtrPush( vStack, pRoot );
    Vec_PtrPush( vStack, (void *)0 );
    while ( Vec_PtrSize(vStack) > 0 )
    {
        // get the node and its fanin
        iFanin = (int)(ABC_PTRINT_T)Vec_PtrPop(vStack);
        pNode  = (Abc_Obj_t *)Vec_PtrPop(vStack);
        assert( !Abc_ObjIsNet(pNode) );
        // add it to the array of nodes if we finished
        if ( iFanin == Abc_ObjFaninNum(pNode) )
        {
            Vec_PtrPush( vNodes, pNode );
            continue;
        }
        // explore the next fanin
        Vec_PtrPush( vStack, pNode );
        Vec_PtrPush( vStack, (void *)(ABC_PTRINT_T)(iFanin+1) );
        // get the fanin
        pFanin = Abc_ObjFanin0Ntk( Abc_ObjFanin(pNode,iFanin) );
        // if this node is already visited, skip
        if ( Abc_NodeIsTravIdCurrent( pFanin ) )
            continue;
        // mark the node as visited
        Abc_NodeSetTravIdCurrent( pFanin );
        // skip the CI
        if ( Abc_ObjIsCi(pFanin) || (Abc_NtkIsStrash(pFanin->pNtk) && Abc_AigNodeIsConst(pFanin)) )
            continue;
        Vec_PtrPush( vStack, pFanin );
        Vec_PtrPush( vStack, (void *)0 );   
    }
}